

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

void VCProjectWriter::outputFilter(VCProject *project,XmlOutput *xml,QString *filtername)

{
  char *pcVar1;
  QArrayData *pQVar2;
  int *piVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  char cVar6;
  long *plVar7;
  undefined **ppuVar8;
  VCFilter *pVVar9;
  XmlOutput *pXVar10;
  char *pcVar11;
  Node *oldD;
  ulong uVar12;
  storage_type *psVar13;
  long lVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  VCFilter filter;
  triState local_5fc;
  xml_output local_5d0;
  xml_output local_598;
  xml_output local_560;
  xml_output local_528;
  VCFilter local_4e8;
  QString local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((project->SingleProjects).d.ptr)->flat_files == true) {
    plVar7 = (long *)operator_new(0x10);
    ppuVar8 = &PTR__FlatNode_002e2dd0;
    *plVar7 = (long)&PTR__FlatNode_002e2dd0;
    plVar7[1] = 0;
  }
  else {
    plVar7 = (long *)operator_new(0x30);
    ppuVar8 = &PTR__TreeNode_002e2d68;
    *plVar7 = (long)&PTR__TreeNode_002e2d68;
    *(undefined1 *)(plVar7 + 1) = 0;
    plVar7[2] = 0;
    plVar7[3] = 0;
    plVar7[4] = 0;
    plVar7[5] = 0;
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  if ((project->SingleProjects).d.size == 0) {
    local_5fc = unset;
  }
  else {
    local_5fc = unset;
    uVar15 = 0;
    do {
      memset(&local_4e8,0xaa,0x448);
      pVVar9 = VCProjectSingleConfig::filterByName
                         ((project->SingleProjects).d.ptr + uVar15,filtername);
      VCFilter::VCFilter(&local_4e8,pVVar9);
      if (local_4e8.Files.d.size != 0) {
        lVar14 = 0;
        uVar12 = 0;
        do {
          (**(code **)(*plVar7 + 0x10))
                    (plVar7,(long)&((local_4e8.Files.d.ptr)->file).d.d + lVar14,
                     &(local_4e8.Files.d.ptr)->excludeFromBuild + lVar14);
          uVar12 = uVar12 + 1;
          lVar14 = lVar14 + 0x20;
        } while (uVar12 < (ulong)local_4e8.Files.d.size);
      }
      if (local_58.d.size == 0) {
        QString::operator=(&local_58,(QString *)&local_4e8);
        QString::operator=(&local_78,(QString *)&local_4e8.Filter);
        local_5fc = local_4e8.ParseFiles;
        QString::operator=(&local_98,(QString *)&local_4e8.Guid);
      }
      VCFilter::~VCFilter(&local_4e8);
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)(project->SingleProjects).d.size);
    ppuVar8 = (undefined **)*plVar7;
  }
  cVar6 = (*(code *)ppuVar8[5])(plVar7);
  if (cVar6 != '\0') {
    if (local_58.d.size != 0) {
      QVar16.m_data = (storage_type *)0x6;
      QVar16.m_size = (qsizetype)&local_4e8;
      QString::fromUtf8(QVar16);
      local_4e8.Filter.d.d = (Data *)local_4e8.Name.d.size;
      pQVar4 = (QArrayData *)CONCAT44(local_4e8.Name.d.d._4_4_,(XMLType)local_4e8.Name.d.d);
      local_4e8.Name.d.d._0_4_ = tTag;
      local_4e8.Name.d.size = (qsizetype)local_4e8.Name.d.ptr;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_4e8.Filter.d.ptr = (char16_t *)0x0;
      local_4e8.Filter.d.size = 0;
      local_4e8.Guid.d.d = (Data *)0x0;
      local_4e8.Name.d.ptr = (char16_t *)pQVar4;
      pXVar10 = XmlOutput::operator<<(xml,(xml_output *)&local_4e8);
      if (local_58.d.size == 0) {
        local_528.xo_type = tNothing;
        local_528.xo_text.d.d = (Data *)0x0;
        local_528.xo_text.d.ptr = (char16_t *)0x0;
        local_528.xo_text.d.size = 0;
        local_528.xo_value.d.d = (Data *)0x0;
        local_528.xo_value.d.ptr = (char16_t *)0x0;
        local_528.xo_value.d.size = 0;
      }
      else {
        QVar17.m_data = (storage_type *)0x4;
        QVar17.m_size = (qsizetype)&local_528;
        QString::fromUtf8(QVar17);
        local_528.xo_text.d.size = (qsizetype)local_528.xo_text.d.ptr;
        pQVar2 = (QArrayData *)CONCAT44(local_528._4_4_,local_528.xo_type);
        local_528.xo_type = tAttribute;
        local_528.xo_text.d.ptr = (char16_t *)local_528.xo_text.d.d;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_528.xo_value.d.d = local_58.d.d;
        local_528.xo_value.d.ptr = local_58.d.ptr;
        local_528.xo_value.d.size = local_58.d.size;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_528.xo_text.d.d = (Data *)pQVar2;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
      }
      pXVar10 = XmlOutput::operator<<(pXVar10,&local_528);
      if (local_78.d.size == 0) {
        local_560.xo_type = tNothing;
        local_560.xo_text.d.d = (Data *)0x0;
        local_560.xo_text.d.ptr = (char16_t *)0x0;
        local_560.xo_text.d.size = 0;
        local_560.xo_value.d.d = (Data *)0x0;
        local_560.xo_value.d.ptr = (char16_t *)0x0;
        local_560.xo_value.d.size = 0;
      }
      else {
        QVar18.m_data = (storage_type *)0x6;
        QVar18.m_size = (qsizetype)&local_560;
        QString::fromUtf8(QVar18);
        local_560.xo_text.d.size = (qsizetype)local_560.xo_text.d.ptr;
        pQVar2 = (QArrayData *)CONCAT44(local_560._4_4_,local_560.xo_type);
        local_560.xo_type = tAttribute;
        local_560.xo_text.d.ptr = (char16_t *)local_560.xo_text.d.d;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_560.xo_value.d.d = local_78.d.d;
        local_560.xo_value.d.ptr = local_78.d.ptr;
        local_560.xo_value.d.size = local_78.d.size;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_560.xo_text.d.d = (Data *)pQVar2;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
      }
      pXVar10 = XmlOutput::operator<<(pXVar10,&local_560);
      if (local_98.d.size == 0) {
        local_598.xo_type = tNothing;
        local_598.xo_text.d.d = (Data *)0x0;
        local_598.xo_text.d.ptr = (char16_t *)0x0;
        local_598.xo_text.d.size = 0;
        local_598.xo_value.d.d = (Data *)0x0;
        local_598.xo_value.d.ptr = (char16_t *)0x0;
        local_598.xo_value.d.size = 0;
      }
      else {
        QVar19.m_data = (storage_type *)0x10;
        QVar19.m_size = (qsizetype)&local_598;
        QString::fromUtf8(QVar19);
        local_598.xo_text.d.size = (qsizetype)local_598.xo_text.d.ptr;
        pQVar2 = (QArrayData *)CONCAT44(local_598._4_4_,local_598.xo_type);
        local_598.xo_type = tAttribute;
        local_598.xo_text.d.ptr = (char16_t *)local_598.xo_text.d.d;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_598.xo_value.d.d = local_98.d.d;
        local_598.xo_value.d.ptr = local_98.d.ptr;
        local_598.xo_value.d.size = local_98.d.size;
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_598.xo_text.d.d = (Data *)pQVar2;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
      }
      pXVar10 = XmlOutput::operator<<(pXVar10,&local_598);
      if (local_5fc == unset) {
        local_5d0.xo_type = tNothing;
        local_5d0.xo_text.d.d = (Data *)0x0;
        local_5d0.xo_text.d.ptr = (char16_t *)0x0;
        local_5d0.xo_text.d.size = 0;
        local_5d0.xo_value.d.d = (Data *)0x0;
        local_5d0.xo_value.d.ptr = (char16_t *)0x0;
        local_5d0.xo_value.d.size = 0;
      }
      else {
        QVar20.m_data = (storage_type *)0xa;
        QVar20.m_size = (qsizetype)&local_5d0;
        QString::fromUtf8(QVar20);
        local_5d0.xo_text.d.size = (qsizetype)local_5d0.xo_text.d.ptr;
        pDVar5 = local_5d0.xo_text.d.d;
        pQVar2 = (QArrayData *)CONCAT44(local_5d0._4_4_,local_5d0.xo_type);
        pcVar11 = "false";
        if (local_5fc == _True) {
          pcVar11 = "true";
        }
        psVar13 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar13 + (long)(pcVar11 + 1);
          psVar13 = psVar13 + 1;
        } while (*pcVar1 != '\0');
        QVar21.m_data = psVar13;
        QVar21.m_size = (qsizetype)&local_5d0;
        QString::fromUtf8(QVar21);
        local_5d0.xo_value.d.size = (qsizetype)local_5d0.xo_text.d.ptr;
        local_5d0.xo_value.d.d = (Data *)CONCAT44(local_5d0._4_4_,local_5d0.xo_type);
        local_5d0.xo_type = tAttribute;
        local_5d0.xo_text.d.ptr = (char16_t *)pDVar5;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_5d0.xo_value.d.ptr = (char16_t *)local_5d0.xo_text.d.d;
        local_5d0.xo_text.d.d = (Data *)pQVar2;
        if ((QArrayData *)local_5d0.xo_value.d.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_5d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_5d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
               + 1;
          UNLOCK();
          LOCK();
          (((QArrayData *)local_5d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_5d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if ((((QArrayData *)local_5d0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate((QArrayData *)local_5d0.xo_value.d.d,2,0x10);
          }
        }
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
      }
      XmlOutput::operator<<(pXVar10,&local_5d0);
      if (&(local_5d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_5d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_5d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_5d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_5d0.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_5d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_5d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_5d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_5d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_5d0.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_598.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_598.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_598.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_598.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_598.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_598.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_598.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_598.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_598.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_598.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_560.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_560.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_560.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_560.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_560.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_560.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_560.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_560.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_560.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_560.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_528.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_528.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_528.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_528.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_528.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_528.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_528.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_528.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_528.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_528.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_4e8.Filter.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate((QArrayData *)local_4e8.Filter.d.ptr,2,0x10);
        }
      }
      if ((QArrayData *)local_4e8.Name.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate((QArrayData *)local_4e8.Name.d.ptr,2,0x10);
        }
      }
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    QVar22.m_data = (storage_type *)0x0;
    QVar22.m_size = (qsizetype)&local_4e8;
    QString::fromUtf8(QVar22);
    local_528.xo_type = (XMLType)local_4e8.Name.d.d;
    local_528._4_4_ = local_4e8.Name.d.d._4_4_;
    local_528.xo_text.d.ptr = (char16_t *)local_4e8.Name.d.size;
    (**(code **)(*plVar7 + 0x20))(plVar7,xml,&local_528,project,filtername);
    piVar3 = (int *)CONCAT44(local_528._4_4_,local_528.xo_type);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_528._4_4_,local_528.xo_type),2,0x10);
      }
    }
    if (local_58.d.size != 0) {
      QVar23.m_data = (storage_type *)0x6;
      QVar23.m_size = (qsizetype)&local_4e8;
      QString::fromUtf8(QVar23);
      local_4e8.Filter.d.d = (Data *)local_4e8.Name.d.size;
      pQVar4 = (QArrayData *)CONCAT44(local_4e8.Name.d.d._4_4_,(XMLType)local_4e8.Name.d.d);
      local_4e8.Name.d.d._0_4_ = tCloseTag;
      local_4e8.Name.d.size = (qsizetype)local_4e8.Name.d.ptr;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_4e8.Filter.d.ptr = (char16_t *)0x0;
      local_4e8.Filter.d.size = 0;
      local_4e8.Guid.d.d = (Data *)0x0;
      local_4e8.Name.d.ptr = (char16_t *)pQVar4;
      XmlOutput::operator<<(xml,(xml_output *)&local_4e8);
      if ((QArrayData *)local_4e8.Filter.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate((QArrayData *)local_4e8.Filter.d.ptr,2,0x10);
        }
      }
      if ((QArrayData *)local_4e8.Name.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate((QArrayData *)local_4e8.Name.d.ptr,2,0x10);
        }
      }
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  (**(code **)(*plVar7 + 8))(plVar7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::outputFilter(VCProject &project, XmlOutput &xml, const QString &filtername)
{
    QScopedPointer<Node> root;
    if (project.SingleProjects.at(0).flat_files)
        root.reset(new FlatNode);
    else
        root.reset(new TreeNode);

    QString name, extfilter, guid;
    triState parse = unset;

    for (int i = 0; i < project.SingleProjects.size(); ++i) {
        const VCFilter filter = project.SingleProjects.at(i).filterByName(filtername);

        // Merge all files in this filter to root tree
        for (int x = 0; x < filter.Files.size(); ++x)
            root->addElement(filter.Files.at(x));

        // Save filter setting from first filter. Next filters
        // may differ but we cannot handle that. (ex. extfilter)
        if (name.isEmpty()) {
            name = filter.Name;
            extfilter = filter.Filter;
            parse = filter.ParseFiles;
            guid = filter.Guid;
        }
    }

    if (!root->hasElements())
        return;

    // Actual XML output ----------------------------------
    if (!name.isEmpty()) {
        xml << tag(_Filter)
                << attrS(_Name, name)
                << attrS(_Filter, extfilter)
                << attrS(_UniqueIdentifier, guid)
                << attrT(_ParseFiles, parse);
    }
    root->generateXML(xml, "", project, filtername); // output root tree
    if (!name.isEmpty())
        xml << closetag(_Filter);
}